

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gha.c
# Opt level: O2

int gha_adjust_info_newton_md(float *pcm,gha_info *info,size_t dim,gha_ctx_t ctx)

{
  gha_info *pgVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  size_t sVar7;
  gha_ctx_t pgVar8;
  double *a;
  int iVar9;
  ulong uVar10;
  long lVar11;
  float *pfVar12;
  long lVar13;
  undefined1 *puVar14;
  size_t sVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  size_t sVar21;
  size_t sVar22;
  float *pfVar23;
  long lVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  undefined1 auStack_178 [8];
  long local_170;
  float *local_168;
  size_t local_160;
  long local_158;
  size_t local_150;
  size_t local_148;
  gha_info *local_140;
  long local_138;
  long local_130;
  undefined1 local_128 [16];
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  float *local_a8;
  long local_a0;
  float *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  size_t local_78;
  long local_70;
  float *local_68;
  long local_60;
  long local_58;
  float local_4c;
  gha_ctx_t local_48;
  double *local_40;
  long local_38;
  
  local_160 = dim * 3;
  local_a0 = dim * 3 + 1;
  local_158 = local_a0 * local_160;
  local_150 = local_158 * 8;
  local_70 = dim * 2;
  local_148 = dim * 0x18;
  local_138 = dim << 4;
  local_68 = &info->magnitude;
  local_130 = dim * 8;
  local_170 = 0;
  puVar14 = auStack_178;
  local_168 = pcm;
  local_140 = info;
  local_78 = dim;
  local_48 = ctx;
  while( true ) {
    pgVar8 = local_48;
    pfVar12 = local_168;
    if (local_170 == 7) {
      return 0;
    }
    sVar21 = local_48->size;
    pfVar23 = local_48->tmp_buf;
    *(undefined8 *)(puVar14 + -8) = 0x101961;
    memcpy(pfVar23,pfVar12,sVar21 << 2);
    sVar21 = pgVar8->size;
    local_a8 = (float *)(puVar14 + -(sVar21 * dim * 4 + 0xf & 0xfffffffffffffff0));
    sVar15 = pgVar8->size;
    uVar10 = sVar15 * dim * 4 + 0xf & 0xfffffffffffffff0;
    local_f0 = (long)local_a8 - uVar10;
    local_e8 = local_f0 - uVar10;
    local_118 = local_e8 - uVar10;
    local_110 = local_118 - uVar10;
    local_108 = local_110 - uVar10;
    local_100 = local_108 - uVar10;
    lVar20 = local_100 - uVar10;
    local_60 = sVar21 << 2;
    local_58 = sVar15 * 4;
    local_f8 = lVar20;
    local_e0 = local_118;
    local_d8 = local_110;
    local_d0 = local_108;
    local_c8 = local_100;
    local_c0 = lVar20;
    local_b8 = local_f0;
    local_b0 = local_e8;
    local_98 = local_a8;
    local_90 = puVar14;
    for (uVar10 = 0; lVar11 = local_b0, lVar13 = local_b8, sVar7 = local_150, uVar10 < sVar15;
        uVar10 = uVar10 + 1) {
      local_38 = CONCAT44(local_38._4_4_,(float)uVar10);
      if ((long)uVar10 < 1) {
        local_4c = (float)(long)-uVar10;
      }
      else {
        local_4c = (float)-uVar10;
      }
      lVar13 = 0;
      pfVar12 = local_68;
      sVar21 = local_78;
      pfVar23 = local_a8;
      while (bVar25 = sVar21 != 0, sVar21 = sVar21 - 1, bVar25) {
        local_128 = ZEXT416((uint)*pfVar12);
        dVar6 = (double)(((gha_info *)(pfVar12 + -2))->frequency * (float)local_38 + pfVar12[-1]);
        local_40 = (double *)dVar6;
        *(undefined8 *)(lVar20 + -8) = 0x101b07;
        dVar6 = sin(dVar6);
        pdVar16 = local_40;
        local_88 = CONCAT44((int)((ulong)dVar6 >> 0x20),(float)dVar6);
        *(undefined8 *)(lVar20 + -8) = 0x101b19;
        dVar6 = cos((double)pdVar16);
        fVar27 = (float)dVar6;
        local_48->tmp_buf[uVar10] =
             local_48->tmp_buf[uVar10] - (float)local_128._0_4_ * (float)local_88;
        *pfVar23 = -(float)local_88;
        *(float *)(local_f0 + lVar13) = (float)local_38 * -(float)local_128._0_4_ * fVar27;
        *(float *)(local_e8 + lVar13) = -(float)local_128._0_4_ * fVar27;
        *(float *)(local_e0 + lVar13) = local_4c * fVar27;
        *(float *)(local_d8 + lVar13) = -fVar27;
        *(float *)(local_d0 + lVar13) =
             (float)local_128._0_4_ * (float)local_38 * (float)local_38 * (float)local_88;
        *(float *)(local_c8 + lVar13) = (float)local_128._0_4_ * (float)local_38 * (float)local_88;
        *(float *)(local_c0 + lVar13) = (float)local_128._0_4_ * (float)local_88;
        pfVar12 = pfVar12 + 3;
        pfVar23 = (float *)((long)pfVar23 + local_60);
        lVar13 = lVar13 + local_58;
      }
      sVar15 = local_48->size;
      local_a8 = local_a8 + 1;
      local_c0 = local_c0 + 4;
      local_c8 = local_c8 + 4;
      local_d0 = local_d0 + 4;
      local_d8 = local_d8 + 4;
      local_e0 = local_e0 + 4;
      local_e8 = local_e8 + 4;
      local_f0 = local_f0 + 4;
      dim = local_78;
    }
    pdVar16 = (double *)(lVar20 - (local_158 * 8 + 0xfU & 0xfffffffffffffff0));
    local_88 = sVar15;
    local_40 = pdVar16;
    pdVar16[-1] = 5.2167946885296e-318;
    memset(pdVar16,0,sVar7);
    sVar7 = local_148;
    sVar21 = local_160;
    pfVar12 = local_98;
    lVar20 = lVar13;
    lVar24 = lVar11;
    for (sVar15 = 0; sVar15 != dim; sVar15 = sVar15 + 1) {
      lVar17 = sVar15 * local_a0;
      lVar18 = (sVar15 + dim) * local_a0;
      lVar19 = (local_70 + sVar15) * local_a0;
      local_38 = lVar24;
      local_128._0_8_ = lVar20;
      pfVar23 = local_98;
      for (sVar22 = 0; sVar22 != dim; sVar22 = sVar22 + 1) {
        lVar24 = dim + sVar22;
        lVar20 = local_70 + sVar22;
        for (uVar10 = 0; local_88 != uVar10; uVar10 = uVar10 + 1) {
          fVar27 = pfVar12[uVar10];
          if (sVar15 == sVar22) {
            local_40[lVar17 + sVar22] = (double)(fVar27 * fVar27) + local_40[lVar17 + sVar22];
            fVar2 = local_48->tmp_buf[uVar10];
            fVar26 = *(float *)(lVar13 + uVar10 * 4);
            local_40[lVar17 + lVar24] =
                 (double)(*(float *)(local_118 + uVar10 * 4) * fVar2 + fVar27 * fVar26) +
                 local_40[lVar17 + lVar24];
            fVar3 = *(float *)(lVar11 + uVar10 * 4);
            local_40[lVar17 + lVar20] =
                 (double)(*(float *)(local_110 + uVar10 * 4) * fVar2 + fVar27 * fVar3) +
                 local_40[lVar17 + lVar20];
            local_40[lVar18 + lVar24] =
                 (double)(*(float *)(local_108 + uVar10 * 4) * fVar2 + fVar26 * fVar26) +
                 local_40[lVar18 + lVar24];
            local_40[lVar18 + lVar20] =
                 (double)(*(float *)(local_100 + uVar10 * 4) * fVar2 + fVar26 * fVar3) +
                 local_40[lVar18 + lVar20];
            fVar26 = fVar2 * *(float *)(local_f8 + uVar10 * 4) + fVar3 * fVar3;
          }
          else {
            local_40[lVar17 + sVar22] =
                 (double)(pfVar23[uVar10] * fVar27) + local_40[lVar17 + sVar22];
            fVar2 = *(float *)(local_128._0_8_ + uVar10 * 4);
            local_40[lVar17 + lVar24] = (double)(fVar27 * fVar2) + local_40[lVar17 + lVar24];
            fVar26 = *(float *)(local_38 + uVar10 * 4);
            local_40[lVar17 + lVar20] = (double)(fVar27 * fVar26) + local_40[lVar17 + lVar20];
            fVar27 = *(float *)(lVar13 + uVar10 * 4);
            local_40[lVar18 + lVar24] = (double)(fVar2 * fVar27) + local_40[lVar18 + lVar24];
            local_40[lVar18 + lVar20] = (double)(fVar27 * fVar26) + local_40[lVar18 + lVar20];
            fVar26 = fVar26 * *(float *)(lVar11 + uVar10 * 4);
          }
          local_40[lVar19 + lVar20] = (double)fVar26 + local_40[lVar19 + lVar20];
        }
        local_40[lVar17 + sVar22] = local_40[lVar17 + sVar22] + local_40[lVar17 + sVar22];
        local_40[lVar17 + lVar24] = local_40[lVar17 + lVar24] + local_40[lVar17 + lVar24];
        local_40[lVar17 + lVar20] = local_40[lVar17 + lVar20] + local_40[lVar17 + lVar20];
        local_40[lVar18 + lVar24] = local_40[lVar18 + lVar24] + local_40[lVar18 + lVar24];
        local_40[lVar18 + lVar20] = local_40[lVar18 + lVar20] + local_40[lVar18 + lVar20];
        local_40[lVar19 + lVar20] = local_40[lVar19 + lVar20] + local_40[lVar19 + lVar20];
        local_40[lVar17 + lVar24] = local_40[lVar18 + sVar22];
        local_40[lVar17 + lVar20] = local_40[lVar19 + sVar22];
        local_40[lVar18 + lVar20] = local_40[lVar19 + lVar24];
        pfVar23 = (float *)((long)pfVar23 + local_60);
        local_128._0_8_ = local_128._0_8_ + local_58;
        local_38 = local_38 + local_58;
        dim = local_78;
      }
      pfVar12 = (float *)((long)pfVar12 + local_60);
      local_118 = local_118 + local_58;
      lVar13 = lVar13 + local_58;
      local_110 = local_110 + local_58;
      lVar11 = lVar11 + local_58;
      local_108 = local_108 + local_58;
      local_100 = local_100 + local_58;
      local_f8 = local_f8 + local_58;
      lVar20 = local_b8;
      lVar24 = local_b0;
    }
    pfVar12 = local_98;
    for (sVar15 = 0; sVar15 != dim; sVar15 = sVar15 + 1) {
      lVar17 = sVar15 * local_a0;
      lVar11 = (sVar15 + dim) * local_a0;
      lVar13 = (local_70 + sVar15) * local_a0;
      for (uVar10 = 0; local_88 != uVar10; uVar10 = uVar10 + 1) {
        fVar27 = local_48->tmp_buf[uVar10];
        local_40[local_160 + lVar17] =
             (double)(pfVar12[uVar10] * fVar27) + local_40[local_160 + lVar17];
        local_40[local_160 + lVar11] =
             (double)(*(float *)(lVar20 + uVar10 * 4) * fVar27) + local_40[local_160 + lVar11];
        local_40[local_160 + lVar13] =
             (double)(fVar27 * *(float *)(lVar24 + uVar10 * 4)) + local_40[local_160 + lVar13];
      }
      local_40[local_160 + lVar17] = local_40[local_160 + lVar17] + local_40[local_160 + lVar17];
      local_40[local_160 + lVar11] = local_40[local_160 + lVar11] + local_40[local_160 + lVar11];
      local_40[local_160 + lVar13] = local_40[local_160 + lVar13] + local_40[local_160 + lVar13];
      pfVar12 = (float *)((long)pfVar12 + local_60);
      lVar20 = lVar20 + local_58;
      lVar24 = lVar24 + local_58;
    }
    pdVar16 = (double *)((long)pdVar16 - (local_160 * 8 + 0xf & 0xfffffffffffffff0));
    pdVar16[-1] = 5.2219971997803e-318;
    memset(pdVar16,0,sVar7);
    a = local_40;
    pdVar16[-1] = 5.22207130962718e-318;
    iVar9 = sle_solve(a,sVar21,pdVar16);
    if (iVar9 != 0) break;
    pfVar12 = local_68;
    for (sVar21 = 0; pfVar23 = local_68, sVar15 = dim, dim != sVar21; sVar21 = sVar21 + 1) {
      *pfVar12 = (float)(pdVar16[sVar21] * -0.8 + (double)*pfVar12);
      uVar4 = ((gha_info *)(pfVar12 + -2))->frequency;
      uVar5 = ((gha_info *)(pfVar12 + -2))->phase;
      dVar6 = *(double *)((long)pdVar16 + sVar21 * 8 + local_138);
      ((gha_info *)(pfVar12 + -2))->frequency =
           (float)(*(double *)((long)pdVar16 + sVar21 * 8 + local_130) * -0.8 + (double)(float)uVar4
                  );
      ((gha_info *)(pfVar12 + -2))->phase = (float)(dVar6 * -0.8 + (double)(float)uVar5);
      pfVar12 = pfVar12 + 3;
    }
    while (sVar15 != 0) {
      fVar27 = *pfVar23;
      if (fVar27 < 0.0) {
        fVar27 = -fVar27;
        *pfVar23 = fVar27;
        pfVar23[-1] = pfVar23[-1] + 3.1415927;
      }
      if (1.0 < fVar27) {
        *pfVar23 = 0.5;
      }
      pfVar23 = pfVar23 + 3;
      sVar15 = sVar15 - 1;
    }
    for (sVar21 = 0; sVar21 != dim; sVar21 = sVar21 + 1) {
      pgVar1 = local_140 + sVar21;
      fVar27 = local_140[sVar21].frequency;
      if (fVar27 < 0.0) {
        fVar27 = -fVar27;
        pgVar1->frequency = fVar27;
        pgVar1->phase = 6.2831855 - pgVar1->phase;
      }
      while (6.2831855 < fVar27) {
        fVar27 = fVar27 + -6.2831855;
        pgVar1->frequency = fVar27;
      }
      if (3.1415927 < fVar27) {
        pgVar1->frequency = 6.2831855 - fVar27;
      }
    }
    for (sVar21 = 0; sVar21 != dim; sVar21 = sVar21 + 1) {
      pfVar12 = &local_140[sVar21].phase;
      fVar27 = *pfVar12;
      while (6.2831855 < fVar27) {
        fVar27 = fVar27 + -6.2831855;
        *pfVar12 = fVar27;
      }
      while (fVar27 < 0.0) {
        fVar27 = fVar27 + 6.2831855;
        *pfVar12 = fVar27;
      }
    }
    local_170 = local_170 + 1;
    puVar14 = local_90;
  }
  *(undefined8 *)(local_90 + -8) = 0xffffffffffffffff;
  return (int)*(undefined8 *)(local_90 + -8);
}

Assistant:

int gha_adjust_info_newton_md(const FLOAT* pcm, struct gha_info* info, size_t dim, gha_ctx_t ctx)
{
	size_t loop;
	size_t i, j, k, n;

	const size_t MAX_LOOPS = 7;

	for (loop = 0; loop < MAX_LOOPS; loop++) {
		memcpy(ctx->tmp_buf, pcm, ctx->size * sizeof(FLOAT));

		// Use VLA for a while
		FLOAT BA[dim][ctx->size];
		FLOAT Bw[dim][ctx->size];
		FLOAT Bp[dim][ctx->size];
		FLOAT BAw[dim][ctx->size];
		FLOAT BAp[dim][ctx->size];
		FLOAT Bww[dim][ctx->size];
		FLOAT Bwp[dim][ctx->size];
		FLOAT Bpp[dim][ctx->size];

		for (n = 0; n < ctx->size; n++) {
			for (k = 0; k < dim; k++) {
				FLOAT Ak = (info+k)->magnitude;
				FLOAT wk = (info+k)->frequency;
				FLOAT pk = (info+k)->phase;
				FLOAT s = sin(wk * n + pk);
				FLOAT c = cos(wk * n + pk);
				ctx->tmp_buf[n] -= Ak * s;

				BA[k][n] = -s;
				Bw[k][n] = -Ak * n * c;
				Bp[k][n] = -Ak * c;

				BAw[k][n] = -n * c;
				BAp[k][n] = -c;
				Bww[k][n] = Ak * n * n * s;
				Bwp[k][n] = Ak * n * s;
				Bpp[k][n] = Ak * s;

			}
		}

		double M[dim * 3][dim * 3 + 1];
		memset(M, '\0', dim * 3 * (dim * 3 + 1) * sizeof(double));
		for (i = 0; i < dim; i++) {
			for (j = 0; j < dim; j++) {
				for (n = 0; n < ctx->size; n++) {
					if (i == j) {
						M[i + dim * 0][j + dim * 0] += BA[i][n] * BA[i][n];
						M[i + dim * 0][j + dim * 1] += ctx->tmp_buf[n] * BAw[i][n] + BA[i][n] * Bw[i][n];
						M[i + dim * 0][j + dim * 2] += ctx->tmp_buf[n] * BAp[i][n] + BA[i][n] * Bp[i][n];

						M[i + dim * 1][j + dim * 1] += ctx->tmp_buf[n] * Bww[i][n] + Bw[i][n] * Bw[i][n];
						M[i + dim * 1][j + dim * 2] += ctx->tmp_buf[n] * Bwp[i][n] + Bw[i][n] * Bp[i][n];

						M[i + dim * 2][j + dim * 2] += ctx->tmp_buf[n] * Bpp[i][n] + Bp[i][n] * Bp[i][n];
					} else {
						M[i + dim * 0][j + dim * 0] += BA[i][n] * BA[j][n];
						M[i + dim * 0][j + dim * 1] += BA[i][n] * Bw[j][n];
						M[i + dim * 0][j + dim * 2] += BA[i][n] * Bp[j][n];

						M[i + dim * 1][j + dim * 1] += Bw[i][n] * Bw[j][n];
						M[i + dim * 1][j + dim * 2] += Bw[i][n] * Bp[j][n];

						M[i + dim * 2][j + dim * 2] += Bp[i][n] * Bp[j][n];
					}
				}
				M[i + dim * 0][j + dim * 0] *= 2;
				M[i + dim * 0][j + dim * 1] *= 2;
				M[i + dim * 0][j + dim * 2] *= 2;

				M[i + dim * 1][j + dim * 1] *= 2;
				M[i + dim * 1][j + dim * 2] *= 2;

				M[i + dim * 2][j + dim * 2] *= 2;


				M[i + dim * 0][j + dim * 1] = M[i + dim * 1][j + dim * 0];
				M[i + dim * 0][j + dim * 2] = M[i + dim * 2][j + dim * 0];
				M[i + dim * 1][j + dim * 2] = M[i + dim * 2][j + dim * 1];
			}
		}

		for (k = 0; k < dim; k++) {
			for (n = 0; n < ctx->size; n++) {
				M[k + dim * 0][dim * 3] += ctx->tmp_buf[n] * BA[k][n];
				M[k + dim * 1][dim * 3] += ctx->tmp_buf[n] * Bw[k][n];
				M[k + dim * 2][dim * 3] += ctx->tmp_buf[n] * Bp[k][n];
			}
			M[k + dim * 0][dim * 3] *= 2;
			M[k + dim * 1][dim * 3] *= 2;
			M[k + dim * 2][dim * 3] *= 2;
		}

		double fx0[dim * 3];
		memset(fx0, '\0', dim * 3 * sizeof(double));
		if(sle_solve(&M[0][0], dim * 3, fx0)) {
			return -1;
		}

		for (k = 0; k < dim; k++) {
			//fprintf(stderr, "delta1: %f\n", fx0[k + dim * 0]);
			//fprintf(stderr, "delta2: %f\n", fx0[k + dim * 1]);
			//fprintf(stderr, "delta3: %f\n", fx0[k + dim * 2]);
			(info+k)->magnitude -= (fx0[k + dim * 0] * 0.8);
			(info+k)->frequency -= (fx0[k + dim * 1] * 0.8);
			(info+k)->phase -=     (fx0[k + dim * 2] * 0.8);
		}

		for (k = 0; k < dim; k++) {
			if ((info+k)->magnitude < 0) {
				(info+k)->magnitude *= -1;
				(info+k)->phase += M_PI;
			}

			if ((info+k)->magnitude > 1) {
				//TODO: ???
				(info+k)->magnitude = 0.5;
			}
		}

		for (k = 0; k < dim; k++) {
			if ((info + k)->frequency < 0) {
				//fprintf(stderr, "negative freq\n");
				(info + k)->frequency *= -1;
				(info + k)->phase = 2 * M_PI - (info + k)->phase;
			}
			while ((info + k)->frequency > M_PI * 2.0) {
				//fprintf(stderr, "freq over\n");
				(info + k)->frequency -= M_PI * 2.0;
			}
			if ((info + k)->frequency > M_PI) {
				//fprintf(stderr, "freq ??\n");
				(info + k)->frequency = 2 * M_PI - (info + k)->frequency;
			}
		}

		for (k = 0; k < dim; k++) {
			while ((info+k)->phase > M_PI * 2.0) {
				(info+k)->phase -= M_PI * 2;
			}
			while ((info + k)->phase < 0) {
				(info+k)->phase += M_PI * 2;
			}
		}
	}
	return 0;
}